

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O3

Gia_Man_t * Acec_InsertBox(Acec_Box_t *pBox,int fAll)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  undefined8 uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  
  p = pBox->pGia;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar20 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar20];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006814dd;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00681559;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00681559;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar20 = lVar20 + 1;
      pVVar11 = p->vCis;
    } while (lVar20 < pVVar11->nSize);
  }
  if (fAll == 0) {
    if (pBox->vShared == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vShared != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xaf,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    if (pBox->vUnique == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vUnique != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xb0,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    pVVar12 = Acec_BuildTree(p_00,p,pBox->vShared,(Vec_Int_t *)0x0);
    pVVar11 = Acec_BuildTree(p_00,p,pBox->vUnique,pVVar12);
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
    }
    free(pVVar12);
  }
  else {
    pVVar11 = Acec_BuildTree(p_00,p,pBox->vLeafLits,(Vec_Int_t *)0x0);
  }
  lVar20 = (long)pBox->vRootLits->nSize;
  if (0 < lVar20) {
    pVVar12 = pBox->vRootLits->pArray;
    lVar16 = 0;
    do {
      lVar17 = (long)pVVar12[lVar16].nSize;
      if (0 < lVar17) {
        piVar6 = pVVar12[lVar16].pArray;
        lVar18 = 0;
        do {
          uVar2 = piVar6[lVar18];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nObjs <= (int)(uVar2 >> 1)) goto LAB_006814dd;
          uVar19 = 0;
          if (lVar18 == 0) {
            if (pVVar11->nSize <= lVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar19 = pVVar11->pArray[lVar16];
            if ((int)uVar19 < 0) goto LAB_0068151b;
          }
          p->pObjs[uVar2 >> 1].Value = uVar2 & 1 ^ uVar19;
          lVar18 = lVar18 + 1;
        } while (lVar17 != lVar18);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar20);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  pVVar11 = p->vCos;
  uVar14 = (ulong)(uint)pVVar11->nSize;
  if (0 < pVVar11->nSize) {
    lVar20 = 0;
    do {
      iVar13 = (int)uVar14;
      iVar1 = pVVar11->pArray[lVar20];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006814dd;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      Acec_InsertBox_rec(p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      lVar20 = lVar20 + 1;
      pVVar11 = p->vCos;
      iVar13 = pVVar11->nSize;
      uVar14 = (ulong)iVar13;
    } while (lVar20 < (long)uVar14);
    if (0 < iVar13) {
      lVar20 = 0;
      do {
        iVar1 = pVVar11->pArray[lVar20];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006814dd:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar1;
        uVar7 = *(undefined8 *)pGVar4;
        uVar2 = pGVar4[-(ulong)((uint)uVar7 & 0x1fffffff)].Value;
        if ((int)uVar2 < 0) {
LAB_0068151b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar19 = uVar2 >> 1;
        if (p_00->nObjs <= (int)uVar19) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p_00->pObjs + uVar19) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar19) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar14 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar14 | 0x80000000;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00681559:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar15 = (ulong)(((uint)((int)pGVar10 - (int)pGVar5) >> 2) * -0x55555555 - uVar19 &
                        0x1fffffff);
        uVar21 = (ulong)((uVar2 << 0x1d ^ (uint)uVar7) & 0x20000000);
        *(ulong *)pGVar10 = uVar21 | uVar14 & 0xffffffffc0000000 | 0x80000000 | uVar15;
        *(ulong *)pGVar10 =
             uVar21 | uVar14 & 0xe0000000c0000000 | 0x80000000 | uVar15 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00681559;
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                           pGVar10);
        }
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00681559;
        pGVar4->Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
        lVar20 = lVar20 + 1;
        pVVar11 = p->vCos;
      } while (lVar20 < pVVar11->nSize);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Acec_InsertBox( Acec_Box_t * pBox, int fAll )
{
    Gia_Man_t * p = pBox->pGia;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRootRanks, * vLevel, * vTemp;
    int i, k, iLit, iLitNew;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // implement tree
    if ( fAll )
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vLeafLits, NULL );
    else
    {
        assert( pBox->vShared != NULL );
        assert( pBox->vUnique != NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vShared, NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vUnique, vTemp = vRootRanks );
        Vec_IntFree( vTemp );
    }
    // update polarity of literals
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = k ? 0 : Vec_IntEntry( vRootRanks, i );
            pObj->Value = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
        }
    Vec_IntFree( vRootRanks );
    // construct the outputs
    Gia_ManForEachCo( p, pObj, i )
        Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}